

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::~Dynamic_Object_Function
          (Dynamic_Object_Function *this)

{
  ~Dynamic_Object_Function(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

Dynamic_Object_Function(std::string t_type_name, const Proxy_Function &t_func, bool t_is_attribute = false)
            : Proxy_Function_Base(t_func->get_param_types(), t_func->get_arity())
            , m_type_name(std::move(t_type_name))
            , m_func(t_func)
            , m_doti(user_type<Dynamic_Object>())
            , m_is_attribute(t_is_attribute) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }